

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignAllIdsDuplicateIdsModel_Test::Annotator_assignAllIdsDuplicateIdsModel_Test
          (Annotator_assignAllIdsDuplicateIdsModel_Test *this)

{
  Annotator_assignAllIdsDuplicateIdsModel_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Annotator_assignAllIdsDuplicateIdsModel_Test_001c2510;
  return;
}

Assistant:

TEST(Annotator, assignAllIdsDuplicateIdsModel)
{
    auto parser = libcellml::Parser::create();
    auto printer = libcellml::Printer::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);
    auto annotator = libcellml::Annotator::create();

    EXPECT_FALSE(annotator->assignAllIds(model));
    EXPECT_EQ(size_t(0), annotator->errorCount());
    EXPECT_EQ(modelStringLotsOfDuplicateIds, printer->printModel(model));
}